

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soac.cpp
# Opt level: O0

string * __thiscall Member::GetType_abi_cxx11_(Member *this)

{
  string *in_RSI;
  string *in_RDI;
  int i;
  string *s;
  int local_28;
  
  std::__cxx11::string::string((string *)in_RDI);
  if (((byte)in_RSI[0x20] & 1) != 0) {
    std::__cxx11::string::operator=((string *)in_RDI,"const ");
  }
  std::__cxx11::string::operator+=((string *)in_RDI,in_RSI);
  for (local_28 = 0; local_28 < *(int *)(in_RSI + 0x24); local_28 = local_28 + 1) {
    std::__cxx11::string::operator+=((string *)in_RDI,"*");
  }
  return in_RDI;
}

Assistant:

std::string GetType() const {
        std::string s;
        if (isConst)
            s = "const ";
        s += type;
        for (int i = 0; i < numPointers; ++i)
            s += "*";
        return s;
    }